

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::selectPivots(CLUFactor<double> *this,double threshold)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  long lVar7;
  int iVar8;
  long in_RDI;
  double in_XMM0_Qa;
  Real RVar9;
  Pring *pr;
  int candidates;
  int mkwtz;
  double x;
  double l_maxabs;
  int beg;
  int len;
  int cl;
  int rw;
  int num;
  int count;
  int m;
  int kk;
  int ll;
  int k;
  int j;
  int i;
  int ii;
  undefined8 *local_68;
  int local_60;
  int local_5c;
  Real local_58;
  double local_50;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_28;
  int local_24;
  int local_18;
  int local_14;
  
  local_24 = -1;
  local_38 = -1;
  local_3c = -1;
  local_58 = 0.0;
  local_60 = (*(int *)(in_RDI + 4) - *(int *)(in_RDI + 0x208)) + -1;
  if (4 < local_60) {
    local_60 = 4;
  }
  local_34 = 0;
  local_30 = 2;
LAB_0028e9c5:
  do {
    local_14 = -1;
    if (*(long *)(*(long *)(in_RDI + 0x248) + (long)local_30 * 0x20) ==
        *(long *)(in_RDI + 0x248) + (long)local_30 * 0x20) {
      if (*(long *)(*(long *)(in_RDI + 0x238) + (long)local_30 * 0x20) ==
          *(long *)(in_RDI + 0x238) + (long)local_30 * 0x20) {
        local_30 = local_30 + 1;
        goto LAB_0028e9c5;
      }
      local_3c = *(int *)(*(long *)(*(long *)(in_RDI + 0x238) + (long)local_30 * 0x20) + 0x10);
      local_18 = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)local_3c * 4) +
                 *(int *)(*(long *)(in_RDI + 0x1a0) + (long)local_3c * 4) + -1;
      iVar8 = local_18 - *(int *)(*(long *)(in_RDI + 0x200) + (long)local_3c * 4);
      local_5c = *(int *)(in_RDI + 4) + 1;
      for (; iVar8 + 1 <= local_18; local_18 = local_18 + -1) {
        iVar5 = *(int *)(*(long *)(in_RDI + 0x180) + (long)local_18 * 4);
        iVar1 = *(int *)(*(long *)(in_RDI + 0x148) + (long)iVar5 * 4);
        if (iVar1 < local_5c) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),
                              (long)iVar5);
          if (*pvVar6 <= 0.0) {
            iVar2 = *(int *)(*(long *)(in_RDI + 0x140) + (long)iVar5 * 4);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                (long)iVar2);
            local_50 = spxAbs<double>(*pvVar6);
            local_28 = iVar2 + *(int *)(*(long *)(in_RDI + 0x148) + (long)iVar5 * 4);
            do {
              iVar4 = local_28;
              local_28 = iVar4 + -1;
              if (local_28 < iVar2) goto LAB_0028ef82;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                  (long)local_28);
              RVar9 = spxAbs<double>(*pvVar6);
              if (local_50 < RVar9) {
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                    (long)local_28);
                local_50 = spxAbs<double>(*pvVar6);
              }
            } while (*(int *)(*(long *)(in_RDI + 0x138) + (long)local_28 * 4) != local_3c);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                (long)local_28);
            local_58 = *pvVar6;
            local_24 = local_28;
LAB_0028ef82:
            for (local_28 = iVar4 + -2; iVar2 < local_28; local_28 = local_28 + -1) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                  (long)local_28);
              RVar9 = spxAbs<double>(*pvVar6);
              if (local_50 < RVar9) {
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                    (long)local_28);
                local_50 = spxAbs<double>(*pvVar6);
              }
            }
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),
                                (long)iVar5);
            *pvVar6 = local_50;
          }
          else {
            iVar2 = *(int *)(*(long *)(in_RDI + 0x140) + (long)iVar5 * 4);
            local_28 = iVar2 + *(int *)(*(long *)(in_RDI + 0x148) + (long)iVar5 * 4);
            do {
              local_28 = local_28 + -1;
              if (local_28 < iVar2) goto LAB_0028ee32;
            } while (*(int *)(*(long *)(in_RDI + 0x138) + (long)local_28 * 4) != local_3c);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                (long)local_28);
            local_58 = *pvVar6;
            local_24 = local_28;
LAB_0028ee32:
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),
                                (long)iVar5);
            local_50 = *pvVar6;
          }
          RVar9 = spxAbs<double>(local_58);
          if ((in_XMM0_Qa * local_50 < RVar9) &&
             (local_14 = local_24, local_5c = iVar1, local_38 = iVar5, iVar1 <= local_30 + 1))
          break;
        }
      }
    }
    else {
      local_38 = *(int *)(*(long *)(*(long *)(in_RDI + 0x248) + (long)local_30 * 0x20) + 0x10);
      iVar8 = *(int *)(*(long *)(in_RDI + 0x140) + (long)local_38 * 4);
      local_18 = *(int *)(*(long *)(in_RDI + 0x148) + (long)local_38 * 4) + iVar8;
      iVar5 = local_18 + -1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),(long)local_38
                         );
      local_50 = *pvVar6;
      if (local_50 < 0.0) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)iVar5)
        ;
        local_50 = spxAbs<double>(*pvVar6);
        for (local_18 = local_18 + -2; iVar8 <= local_18; local_18 = local_18 + -1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                              (long)local_18);
          RVar9 = spxAbs<double>(*pvVar6);
          if (local_50 < RVar9) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                                (long)local_18);
            local_50 = spxAbs<double>(*pvVar6);
          }
        }
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),
                            (long)local_38);
        *pvVar6 = local_50;
      }
      local_5c = *(int *)(in_RDI + 4) + 1;
      for (local_18 = iVar5; iVar8 <= local_18; local_18 = local_18 + -1) {
        iVar5 = *(int *)(*(long *)(in_RDI + 0x138) + (long)local_18 * 4);
        iVar1 = *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar5 * 4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),
                            (long)local_18);
        local_58 = *pvVar6;
        if (((iVar1 < local_5c) && (RVar9 = spxAbs<double>(local_58), in_XMM0_Qa * local_50 < RVar9)
            ) && (local_14 = local_18, local_5c = iVar1, local_3c = iVar5, iVar1 <= local_30))
        break;
      }
    }
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x230) + (long)local_3c * 0x20) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x230) + (long)local_3c * 0x20 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x230) + (long)local_3c * 0x20 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x230) + (long)local_3c * 0x20);
    lVar7 = *(long *)(in_RDI + 0x230) + (long)local_3c * 0x20;
    *(long *)(*(long *)(in_RDI + 0x230) + (long)local_3c * 0x20) = lVar7;
    *(long *)(*(long *)(in_RDI + 0x230) + (long)local_3c * 0x20 + 8) = lVar7;
    if (-1 < local_14) {
      *(int *)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20 + 0x14) =
           local_14 - *(int *)(*(long *)(in_RDI + 0x140) + (long)local_38 * 4);
      iVar8 = (local_5c + -1) * (local_30 + -1);
      *(int *)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20 + 0x18) = iVar8;
      for (local_68 = *(undefined8 **)(in_RDI + 0x210);
          ((-1 < *(int *)(local_68 + 2) && (*(int *)(local_68 + 2) != local_38)) &&
          (*(int *)(local_68 + 3) < iVar8)); local_68 = (undefined8 *)*local_68) {
      }
      plVar3 = (long *)local_68[1];
      if ((int)plVar3[2] != local_38) {
        *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20) + 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20 + 8);
        **(undefined8 **)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20 + 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20);
        *(long *)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20) = *plVar3;
        *(long *)(*(long *)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20) + 8) =
             *(long *)(in_RDI + 0x240) + (long)local_38 * 0x20;
        *(long **)(*(long *)(in_RDI + 0x240) + (long)local_38 * 0x20 + 8) = plVar3;
        *plVar3 = *(long *)(in_RDI + 0x240) + (long)local_38 * 0x20;
      }
      local_34 = local_34 + 1;
      if (local_60 <= local_34) {
        return;
      }
    }
  } while( true );
}

Assistant:

void CLUFactor<R>::selectPivots(R threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   R l_maxabs;
   R x = R(0.0);   // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if((l_maxabs = temp.s_max[rw]) < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactor<R>::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}